

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepExamples.cpp
# Opt level: O0

void writeDeepScanlineFile
               (char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ,
               Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 *puVar4;
  uint *puVar5;
  float **ppfVar6;
  half **pphVar7;
  float *pfVar8;
  half *phVar9;
  Array2D<float_*> *in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  Array2D<Imath_3_2::half_*> *in_R8;
  Array2D<unsigned_int> *in_R9;
  int j_1;
  int i_1;
  int j;
  int i;
  DeepFrameBuffer frameBuffer;
  DeepScanLineOutputFile file;
  Header header;
  int width;
  int height;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffd64;
  Array2D<float_*> *in_stack_fffffffffffffd68;
  DeepFrameBuffer *in_stack_fffffffffffffd70;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  DeepSlice local_1c8 [56];
  DeepSlice local_190 [56];
  Slice local_158 [56];
  Slice local_120 [104];
  undefined1 local_b8 [36];
  Channel local_94 [28];
  Vec2<float> local_78;
  string local_70 [56];
  int local_38;
  int local_34;
  Array2D<unsigned_int> *local_30;
  Array2D<Imath_3_2::half_*> *local_28;
  Array2D<float_*> *local_20;
  char *local_8;
  
  local_34 = (in_RDX[3] - in_RDX[1]) + 1;
  local_38 = (in_RDX[2] - *in_RDX) + 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header((Header *)0x3f800000,local_70,in_RSI,in_RDX,&local_78,0,3);
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_94,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)0x1206a1);
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)(local_b8 + 0x14),HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)0x1206a7);
  Imf_3_4::Header::setType(local_70);
  puVar4 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar4 = 2;
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)local_b8,local_8,(Header *)local_70,iVar1);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffd70);
  puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](local_30,0);
  Imf_3_4::Slice::Slice
            (local_158,UINT,(char *)(puVar5 + (-(long)*in_RDX - (long)(in_RDX[1] * local_38))),4,
             (long)local_38 << 2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_120);
  ppfVar6 = Imf_3_4::Array2D<float_*>::operator[](local_20,0);
  Imf_3_4::DeepSlice::DeepSlice
            (local_190,FLOAT,(char *)(ppfVar6 + (-(long)*in_RDX - (long)(in_RDX[1] * local_38))),8,
             (long)local_38 << 3,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_120,(DeepSlice *)0x1206a1);
  pphVar7 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](local_28,0);
  uVar10 = 0;
  Imf_3_4::DeepSlice::DeepSlice
            (local_1c8,HALF,(char *)(pphVar7 + (-(long)*in_RDX - (long)(in_RDX[1] * local_38))),8,
             (long)local_38 << 3,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)local_120,(DeepSlice *)0x1206a7);
  Imf_3_4::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)local_b8);
  for (local_1cc = 0; local_1cc < local_34; local_1cc = local_1cc + 1) {
    for (local_1d0 = 0; local_1d0 < local_38; local_1d0 = local_1d0 + 1) {
      uVar2 = getPixelSampleCount(local_1cc,local_1d0);
      puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](local_30,(long)local_1cc);
      puVar5[local_1d0] = uVar2;
      puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](local_30,(long)local_1cc);
      pfVar8 = (float *)operator_new__((ulong)puVar5[local_1d0] << 2);
      ppfVar6 = Imf_3_4::Array2D<float_*>::operator[](local_20,(long)local_1cc);
      ppfVar6[local_1d0] = pfVar8;
      puVar5 = Imf_3_4::Array2D<unsigned_int>::operator[](local_30,(long)local_1cc);
      phVar9 = (half *)operator_new__((ulong)puVar5[local_1d0] * 2);
      pphVar7 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](local_28,(long)local_1cc);
      pphVar7[local_1d0] = phVar9;
      getPixelSampleData((int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                         (int)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                         (Array2D<Imath_3_2::half_*> *)CONCAT44(in_stack_fffffffffffffd64,uVar10));
    }
    Imf_3_4::DeepScanLineOutputFile::writePixels((int)local_b8);
  }
  for (local_1d4 = 0; local_1d4 < local_34; local_1d4 = local_1d4 + 1) {
    for (local_1d8 = 0; local_1d8 < local_38; local_1d8 = local_1d8 + 1) {
      ppfVar6 = Imf_3_4::Array2D<float_*>::operator[](local_20,(long)local_1d4);
      if (ppfVar6[local_1d8] != (float *)0x0) {
        operator_delete__(ppfVar6[local_1d8]);
      }
      pphVar7 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](local_28,(long)local_1d4);
      if (pphVar7[local_1d8] != (half *)0x0) {
        operator_delete__(pphVar7[local_1d8]);
      }
    }
  }
  Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x114d12);
  Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)local_b8);
  Imf_3_4::Header::~Header((Header *)local_70);
  return;
}

Assistant:

void
writeDeepScanlineFile (
    const char       filename[],
    Box2i            displayWindow,
    Box2i            dataWindow,
    Array2D<float*>& dataZ,

    Array2D<half*>& dataA,

    Array2D<unsigned int>& sampleCount)

{
    //
    // Write a deep image with only a A (alpha) and a Z (depth) channel,
    // using class DeepScanLineOutputFile.
    //
    //    - create a file header
    //    - add A and Z channels to the header
    //    - open the file, and store the header in the file
    //    - describe the memory layout of the A and Z pixels
    //    - store the pixels in the file
    //

    int height = dataWindow.max.y - dataWindow.min.y + 1;
    int width  = dataWindow.max.x - dataWindow.min.x + 1;

    Header header (displayWindow, dataWindow);

    header.channels ().insert ("Z", Channel (FLOAT));
    header.channels ().insert ("A", Channel (HALF));
    header.setType (DEEPSCANLINE);
    header.compression () = ZIPS_COMPRESSION;

    DeepScanLineOutputFile file (filename, header);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x -
                 dataWindow.min.y * width),
        sizeof (unsigned int) * 1, // xS

        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (float*) * 1, // xStride for pointer

            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for Z data sample

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for A data sample

    file.setFrameBuffer (frameBuffer);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            sampleCount[i][j] = getPixelSampleCount (i, j);
            dataZ[i][j]       = new float[sampleCount[i][j]];
            dataA[i][j]       = new half[sampleCount[i][j]];
            // Generate data for dataZ and dataA.
            getPixelSampleData (i, j, dataZ, dataA);
        }

        file.writePixels (1);
    }

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}